

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O1

void __thiscall
AmstradCPC::ConcreteMachine<false>::flush_output(ConcreteMachine<false> *this,int outputs)

{
  long lVar1;
  long lVar2;
  
  if ((outputs & 2U) != 0) {
    lVar1 = (this->ay_).cycles_since_update_.super_WrappedInt<HalfCycles>.length_;
    lVar2 = lVar1 + 7;
    if (-1 < lVar1) {
      lVar2 = lVar1;
    }
    (this->ay_).cycles_since_update_.super_WrappedInt<HalfCycles>.length_ = lVar1 % 8;
    Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<true>_>::run_for
              (&(this->ay_).speaker_,&(this->ay_).audio_queue_,(Cycles)(lVar2 >> 3));
    if ((this->ay_).audio_queue_.actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        (this->ay_).audio_queue_.actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      std::condition_variable::notify_all();
      return;
    }
  }
  return;
}

Assistant:

void flush_output(int outputs) final {
			// Just flush the AY.
			if(outputs & Output::Audio) {
				ay_.update();
				ay_.flush();
			}

			// Always flush the FDC.
			flush_fdc();
		}